

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteStream.c
# Opt level: O2

void sysbvm_byteStream_nextPutStringWithSize
               (sysbvm_context_t *context,sysbvm_tuple_t byteStream,size_t stringSize,char *string)

{
  ulong requiredCapacity;
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  ulong uVar3;
  long lVar4;
  
  if (((stringSize != 0) && (byteStream != 0)) && ((byteStream & 0xf) == 0)) {
    uVar1 = *(ulong *)(byteStream + 0x10);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      lVar4 = (long)uVar1 >> 4;
    }
    else {
      lVar4 = *(long *)(uVar1 + 0x10);
    }
    uVar1 = *(ulong *)(byteStream + 0x18);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      uVar3 = (ulong)*(uint *)(uVar1 + 0xc);
    }
    else {
      uVar3 = 0;
    }
    requiredCapacity = stringSize + lVar4;
    if (uVar3 < requiredCapacity) {
      sysbvm_byteStream_increaseCapacityToAtLeast(context,byteStream,requiredCapacity);
      uVar1 = *(ulong *)(byteStream + 0x18);
    }
    memcpy((void *)(uVar1 + lVar4 + 0x10),string,stringSize);
    sVar2 = sysbvm_tuple_size_encode(context,requiredCapacity);
    *(sysbvm_tuple_t *)(byteStream + 0x10) = sVar2;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_byteStream_nextPutStringWithSize(sysbvm_context_t *context, sysbvm_tuple_t byteStream, size_t stringSize, const char *string)
{
    if(!sysbvm_tuple_isNonNullPointer(byteStream) || stringSize == 0)
        return;

    sysbvm_byteStream_t *byteStreamObject = (sysbvm_byteStream_t*)byteStream;
    size_t size = sysbvm_tuple_size_decode(byteStreamObject->size);
    size_t capacity = sysbvm_tuple_getSizeInBytes(byteStreamObject->storage);
    size_t requiredCapacity = size + stringSize;
    if(requiredCapacity > capacity)
        sysbvm_byteStream_increaseCapacityToAtLeast(context, byteStream, requiredCapacity);

    sysbvm_object_tuple_t *storage = (sysbvm_object_tuple_t*)byteStreamObject->storage;
    memcpy(storage->bytes + size, string, stringSize);
    byteStreamObject->size = sysbvm_tuple_size_encode(context, size + stringSize);
}